

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcompress.c
# Opt level: O0

int uncompress2mem(char *filename,FILE *diskfile,char **buffptr,size_t *buffsize,
                  _func_void_ptr_void_ptr_size_t *mem_realloc,size_t *filesize,int *status)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  ulong *in_RCX;
  long *in_RDX;
  FILE *in_RSI;
  code *in_R8;
  undefined8 *in_R9;
  int *in_stack_00000008;
  uInt outbuffsize;
  uLong iPage;
  uLong nPages;
  z_stream d_stream;
  char *filebuff;
  int len;
  int err;
  undefined4 local_d0;
  ulong local_c8;
  void *local_b8;
  int local_b0;
  long local_a0;
  undefined4 local_98;
  undefined8 local_90;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  void *local_48;
  int local_40;
  int local_3c;
  undefined8 *local_38;
  code *local_30;
  ulong *local_28;
  long *local_20;
  FILE *local_18;
  int local_4;
  
  uVar2 = *in_RCX / 0xffffffff;
  local_c8 = 0;
  if (uVar2 == 0) {
    local_d0 = (undefined4)*in_RCX;
  }
  else {
    local_d0 = 0xffffffff;
  }
  if (*in_stack_00000008 < 1) {
    local_38 = in_R9;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_48 = malloc(0x1c200);
    if (local_48 == (void *)0x0) {
      *in_stack_00000008 = 0x71;
      local_4 = 0x71;
    }
    else {
      local_78 = 0;
      local_70 = 0;
      local_68 = 0;
      local_a0 = *local_20;
      local_98 = local_d0;
      iVar1 = inflateInit2_(&local_b8,0x1f,"1.2.11",0x70);
      if (iVar1 == 0) {
        local_3c = 0;
        do {
          sVar3 = fread(local_48,1,0x1c200,local_18);
          local_40 = (int)sVar3;
          iVar1 = ferror(local_18);
          if (iVar1 != 0) {
            inflateEnd(&local_b8);
            free(local_48);
            *in_stack_00000008 = 0x19e;
            return 0x19e;
          }
          if (local_40 == 0) break;
          local_b8 = local_48;
          local_b0 = local_40;
          while (local_3c = inflate(&local_b8,0), local_3c != 1) {
            if ((local_3c != 0) && (local_3c != -5)) {
              inflateEnd(&local_b8);
              free(local_48);
              *in_stack_00000008 = 0x19e;
              return 0x19e;
            }
            if (local_b0 == 0) break;
            if (local_c8 < uVar2) {
              local_c8 = local_c8 + 1;
              local_a0 = *local_20 + local_c8 * 0xffffffff;
              if (local_c8 < uVar2) {
                local_98 = 0xffffffff;
              }
              else {
                local_98 = (undefined4)(*local_28 % 0xffffffff);
              }
            }
            else {
              if (local_30 == (code *)0x0) {
                inflateEnd(&local_b8);
                free(local_48);
                *in_stack_00000008 = 0x19e;
                return 0x19e;
              }
              lVar4 = (*local_30)(*local_20);
              *local_20 = lVar4;
              if (*local_20 == 0) {
                inflateEnd(&local_b8);
                free(local_48);
                *in_stack_00000008 = 0x19e;
                return 0x19e;
              }
              local_98 = 0x7080;
              local_a0 = *local_20 + *local_28;
              *local_28 = *local_28 + 0x7080;
            }
          }
          iVar1 = feof(local_18);
        } while (iVar1 == 0);
        *local_38 = local_90;
        free(local_48);
        iVar1 = inflateEnd(&local_b8);
        if (iVar1 == 0) {
          local_4 = *in_stack_00000008;
        }
        else {
          *in_stack_00000008 = 0x19e;
          local_4 = 0x19e;
        }
      }
      else {
        *in_stack_00000008 = 0x19e;
        local_4 = 0x19e;
      }
    }
  }
  else {
    local_4 = *in_stack_00000008;
  }
  return local_4;
}

Assistant:

int uncompress2mem(char *filename,  /* name of input file                 */
             FILE *diskfile,     /* I - file pointer                        */
             char **buffptr,   /* IO - memory pointer                     */
             size_t *buffsize,   /* IO - size of buffer, in bytes           */
             void *(*mem_realloc)(void *p, size_t newsize), /* function     */
             size_t *filesize,   /* O - size of file, in bytes              */
             int *status)        /* IO - error status                       */

/*
  Uncompress the disk file into memory.  Fill whatever amount of memory has
  already been allocated, then realloc more memory, using the supplied
  input function, if necessary.
*/
{
    int err, len;
    char *filebuff;
    z_stream d_stream;   /* decompression stream */
    /* Input args buffptr and buffsize may refer to a block of memory
        larger than the 2^32 4 byte limit.  If so, must be broken
        up into "pages" when assigned to d_stream.  
        (d_stream.avail_out is a uInt type, which might be smaller
        than buffsize's size_t type.)
    */
    const uLong nPages = (uLong)(*buffsize)/(uLong)UINT_MAX;
    uLong iPage=0;
    uInt outbuffsize = (nPages > 0) ? UINT_MAX : (uInt)(*buffsize);
    

    if (*status > 0) 
        return(*status); 

    /* Allocate memory to hold compressed bytes read from the file. */
    filebuff = (char*)malloc(GZBUFSIZE);
    if (!filebuff) return(*status = 113); /* memory error */

    d_stream.zalloc = (alloc_func)0;
    d_stream.zfree = (free_func)0;
    d_stream.opaque = (voidpf)0;
    d_stream.next_out = (unsigned char*) *buffptr;
    d_stream.avail_out = outbuffsize;

    /* Initialize the decompression.  The argument (15+16) tells the
       decompressor that we are to use the gzip algorithm */

    err = inflateInit2(&d_stream, (15+16));
    if (err != Z_OK) return(*status = 414);

    /* loop through the file, reading a buffer and uncompressing it */
    for (;;)
    {
        len = fread(filebuff, 1, GZBUFSIZE, diskfile);
	if (ferror(diskfile)) {
              inflateEnd(&d_stream);
              free(filebuff);
              return(*status = 414);
	}

        if (len == 0) break;  /* no more data */

        d_stream.next_in = (unsigned char*)filebuff;
        d_stream.avail_in = len;

        for (;;) {
            /* uncompress as much of the input as will fit in the output */
            err = inflate(&d_stream, Z_NO_FLUSH);

            if (err == Z_STREAM_END ) { /* We reached the end of the input */
	        break; 
            } else if (err == Z_OK || err == Z_BUF_ERROR) { 
	        /* Z_BUF_ERROR means need more input data to make progress */
                if (!d_stream.avail_in) break; /* need more input */
		
                /* need more space in output buffer */
                /* First check if more memory is available above the
                    4Gb limit in the originally input buffptr array */
                if (iPage < nPages)
                {
                   ++iPage;
                   d_stream.next_out = (unsigned char*)(*buffptr + iPage*(uLong)UINT_MAX);
                   if (iPage < nPages)
                      d_stream.avail_out = UINT_MAX;
                   else
                      d_stream.avail_out = (uInt)((uLong)(*buffsize) % (uLong)UINT_MAX);
                }
                else if (mem_realloc) {   
                    *buffptr = mem_realloc(*buffptr,*buffsize + BUFFINCR);
                    if (*buffptr == NULL){
                        inflateEnd(&d_stream);
                        free(filebuff);
                        return(*status = 414);  /* memory allocation failed */
                    }

                    d_stream.avail_out = BUFFINCR;
                    d_stream.next_out = (unsigned char*) (*buffptr + *buffsize);
                    *buffsize = *buffsize + BUFFINCR;
                } else  { /* error: no realloc function available */
                    inflateEnd(&d_stream);
                    free(filebuff);
                    return(*status = 414);
                }
            } else {  /* some other error */
                inflateEnd(&d_stream);
                free(filebuff);
                return(*status = 414);
            }
        }
	
	if (feof(diskfile))  break;
/*     
        These settings for next_out and avail_out appear to be redundant,
        as the inflate() function should already be re-setting these.
        For case where *buffsize < 4Gb this did not matter, but for
        > 4Gb it would produce the wrong value in the avail_out assignment.
        (C. Gordon Jul 2016)
        d_stream.next_out = (unsigned char*) (*buffptr + d_stream.total_out);
        d_stream.avail_out = *buffsize - d_stream.total_out;
*/    }

    /* Set the output file size to be the total output data */
    *filesize = d_stream.total_out;
    
    free(filebuff); /* free temporary output data buffer */
    
    err = inflateEnd(&d_stream); /* End the decompression */
    if (err != Z_OK) return(*status = 414);
  
    return(*status);
}